

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng::save_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  const_reference local_238;
  char local_218 [8];
  ofstream file;
  string *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_218,pcVar3,_Var2);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(buffer);
  if (bVar1) {
    local_238 = (const_reference)0x0;
  }
  else {
    local_238 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  std::ostream::write(local_218,(long)local_238);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void save_file(const std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ofstream file(filename.c_str(), std::ios::out|std::ios::binary);
  file.write(buffer.empty() ? 0 : (char*)&buffer[0], std::streamsize(buffer.size()));
}